

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall
MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::VRDatumSpecialized
          (VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *this,float inVal)

{
  list<float,_std::allocator<float>_> *this_00;
  float inVal_local;
  
  inVal_local = inVal;
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_FLOAT);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00124350;
  this_00 = &this->value;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->value).super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  std::__cxx11::list<float,_std::allocator<float>_>::push_front(this_00,&inVal_local);
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }